

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOUAmount.cpp
# Opt level: O2

IOUAmount jbcoin::mulRatio(IOUAmount *amt,uint32_t num,uint32_t den,bool roundUp)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  __normal_iterator<const_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_*,_std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
  _Var6;
  int iVar7;
  uint uVar8;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  *__return_storage_ptr__;
  bool bVar9;
  undefined1 auVar10 [16];
  IOUAmount IVar11;
  IOUAmount result;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  low;
  IOUAmount local_98;
  uint128_t den128;
  uint128_t rem;
  uint128_t mul;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_58;
  number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
  local_48;
  
  if (den == 0) {
    Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"division by zero");
  }
  if (mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::powerTable == '\0') {
    iVar7 = __cxa_guard_acquire();
    if (iVar7 != 0) {
      mulRatio::powerTable.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      mulRatio::powerTable.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      mulRatio::powerTable.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ::reserve(&mulRatio::powerTable,0x1e);
      den128.m_backend.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ = 0;
      den128.m_backend.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._0_8_ = 1;
      iVar7 = 0x1e;
      while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ::push_back(&mulRatio::powerTable,&den128);
        mul.m_backend.
        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
        .m_data._0_4_ = 10;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,int>
                  (&den128.m_backend,(int *)&mul);
      }
      __cxa_atexit(std::
                   vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ::~vector,&mulRatio::powerTable,&__dso_handle);
      __cxa_guard_release(&mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::
                           powerTable);
    }
  }
  if (mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::fl64 == '\0') {
    iVar7 = __cxa_guard_acquire();
    if (iVar7 != 0) {
      den128.m_backend.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ = 0;
      den128.m_backend.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._0_8_ = 0x7fffffffffffffff;
      _Var6 = std::
              __lower_bound<__gnu_cxx::__normal_iterator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>const*,std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>>>>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)0>,__gnu_cxx::__ops::_Iter_less_val>
                        (mulRatio::powerTable.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         mulRatio::powerTable.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      auVar10[0] = -((char)((_Var6._M_current)->m_backend).
                           super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                           .m_data ==
                    (char)den128.m_backend.
                          super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                          .m_data);
      auVar10[1] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                      .m_data + 1) ==
                    den128.m_backend.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data._1_1_);
      auVar10[2] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                      .m_data + 2) ==
                    den128.m_backend.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data._2_1_);
      auVar10[3] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                      .m_data + 3) ==
                    den128.m_backend.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data._3_1_);
      auVar10[4] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                      .m_data + 4) ==
                    den128.m_backend.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data._4_1_);
      auVar10[5] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                      .m_data + 5) ==
                    den128.m_backend.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data._5_1_);
      auVar10[6] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                      .m_data + 6) ==
                    den128.m_backend.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data._6_1_);
      auVar10[7] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                      .m_data + 7) ==
                    den128.m_backend.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data._7_1_);
      auVar10[8] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                      .m_data + 8) ==
                    den128.m_backend.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data._8_1_);
      auVar10[9] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                      .m_data + 9) ==
                    den128.m_backend.
                    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                    .m_data._9_1_);
      auVar10[10] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                       super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                       .m_data + 10) ==
                     den128.m_backend.
                     super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                     .m_data._10_1_);
      auVar10[0xb] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                        .m_data + 0xb) ==
                      den128.m_backend.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data._11_1_);
      auVar10[0xc] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                        .m_data + 0xc) ==
                      den128.m_backend.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data._12_1_);
      auVar10[0xd] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                        .m_data + 0xd) ==
                      den128.m_backend.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data._13_1_);
      auVar10[0xe] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                        .m_data + 0xe) ==
                      den128.m_backend.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data._14_1_);
      auVar10[0xf] = -(*(char *)((long)&((_Var6._M_current)->m_backend).
                                        super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                                        .m_data + 0xf) ==
                      den128.m_backend.
                      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                      .m_data._15_1_);
      mulRatio::fl64 =
           (int)((ulong)((long)_Var6._M_current -
                        (long)mulRatio::powerTable.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) -
           (uint)((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar10[0xf] >> 7) << 0xf) != 0xffff);
      __cxa_guard_release(&mulRatio(jbcoin::IOUAmount_const&,unsigned_int,unsigned_int,bool)::fl64);
    }
  }
  uVar1 = amt->mantissa_;
  den128.m_backend.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._0_8_ = (ulong)den;
  den128.m_backend.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._8_8_ = 0;
  low.m_backend.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._0_8_ = -uVar1;
  if (0 < (long)uVar1) {
    low.m_backend.
    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data._0_8_ = uVar1;
  }
  low.m_backend.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._8_8_ = 0;
  rem.m_backend.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._8_8_ = 0;
  __return_storage_ptr__ = &mul;
  rem.m_backend.
  super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
  .m_data._0_8_ = (ulong)num;
  boost::multiprecision::operator*(__return_storage_ptr__,&low,&rem);
  boost::multiprecision::operator/(&low,__return_storage_ptr__,&den128);
  boost::multiprecision::operator*
            ((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&result,&low,&den128);
  boost::multiprecision::operator-
            (&rem,__return_storage_ptr__,
             (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&result);
  iVar4 = mulRatio::fl64;
  iVar7 = amt->exponent_;
  if ((ulong)rem.m_backend.
             super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
             .m_data == 0 &&
      rem.m_backend.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ == 0) {
    bVar9 = false;
  }
  else {
    iVar3 = mulRatio::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&low,__return_storage_ptr__);
    uVar8 = iVar4 - iVar3;
    if (uVar8 != 0 && iVar3 <= iVar4) {
      iVar7 = iVar7 - uVar8;
      boost::multiprecision::backends::
      eval_multiply<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                (&low.m_backend,
                 &mulRatio::powerTable.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].m_backend);
      boost::multiprecision::backends::
      eval_multiply<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                (&rem.m_backend,
                 &mulRatio::powerTable.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar8].m_backend);
    }
    __return_storage_ptr__ = &rem;
    boost::multiprecision::operator/
              ((number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&result,__return_storage_ptr__,&den128);
    boost::multiprecision::backends::
    eval_add<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
              (&low.m_backend,
               (cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>
                *)&result);
    boost::multiprecision::operator*
              (&local_58,
               (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&result,&den128);
    boost::multiprecision::operator-(&local_48,__return_storage_ptr__,&local_58);
    rem.m_backend.
    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data._0_8_ =
         (ulong)local_48.m_backend.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data;
    rem.m_backend.
    super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
    .m_data._8_8_ =
         local_48.m_backend.
         super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
         .m_data._8_8_;
    bVar9 = (ulong)local_48.m_backend.
                   super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   .m_data != 0 ||
            local_48.m_backend.
            super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
            .m_data._8_8_ != 0;
  }
  iVar4 = mulRatio::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)&low,__return_storage_ptr__);
  uVar8 = iVar4 - mulRatio::fl64;
  if (uVar8 != 0 && mulRatio::fl64 <= iVar4) {
    result.mantissa_ =
         (ulong)low.m_backend.
                super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                .m_data;
    result._8_8_ = low.m_backend.
                   super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                   .m_data._8_8_;
    boost::multiprecision::backends::
    eval_divide<128u,128u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
              (&low.m_backend,
               &mulRatio::powerTable.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar8].m_backend);
    bVar2 = !bVar9;
    bVar9 = true;
    if (bVar2) {
      boost::multiprecision::operator*
                (&local_58,&low,
                 mulRatio::powerTable.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8);
      boost::multiprecision::operator-
                (&local_48,
                 (number<boost::multiprecision::backends::cpp_int_backend<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&result,&local_58);
      bVar9 = (ulong)local_48.m_backend.
                     super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                     .m_data != 0 ||
              local_48.m_backend.
              super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
              .m_data._8_8_ != 0;
    }
    iVar7 = iVar7 + uVar8;
  }
  uVar5 = (ulong)low.m_backend.
                 super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
                 .m_data;
  if (0x7ffffffffffffffe <
      (ulong)low.m_backend.
             super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
             .m_data) {
    uVar5 = 0x7fffffffffffffff;
  }
  if (low.m_backend.
      super_cpp_int_base<128U,_128U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void,_true>
      .m_data._8_8_ != 0) {
    uVar5 = 0x7fffffffffffffff;
  }
  result.mantissa_ = -uVar5;
  if (-1 < (long)uVar1) {
    result.mantissa_ = uVar5;
  }
  result.exponent_ = iVar7;
  IOUAmount::normalize(&result);
  if (!bVar9) {
LAB_001e047e:
    local_98.mantissa_ = result.mantissa_;
    local_98.exponent_ = result.exponent_;
    goto LAB_001e04d2;
  }
  if (roundUp && -1 < (long)uVar1) {
    if (result.mantissa_ != 0) {
      local_98.mantissa_ = result.mantissa_ + 1;
      goto LAB_001e0497;
    }
    local_98.mantissa_ = 1000000000000000;
LAB_001e04be:
    local_98.exponent_ = -0x60;
  }
  else {
    if (-1 < (long)uVar1 || roundUp) goto LAB_001e047e;
    if (result.mantissa_ == 0) {
      local_98.mantissa_ = -1000000000000000;
      goto LAB_001e04be;
    }
    local_98.mantissa_ = result.mantissa_ + -1;
LAB_001e0497:
    local_98.exponent_ = result.exponent_;
  }
  IOUAmount::normalize(&local_98);
LAB_001e04d2:
  IVar11.exponent_ = local_98.exponent_;
  IVar11.mantissa_ = local_98.mantissa_;
  IVar11._12_4_ = 0;
  return IVar11;
}

Assistant:

IOUAmount
mulRatio (
    IOUAmount const& amt,
    std::uint32_t num,
    std::uint32_t den,
    bool roundUp)
{
    using namespace boost::multiprecision;

    if (!den)
        Throw<std::runtime_error> ("division by zero");

    // A vector with the value 10^index for indexes from 0 to 29
    // The largest intermediate value we expect is 2^96, which
    // is less than 10^29
    static auto const powerTable = []
    {
        std::vector<uint128_t> result;
        result.reserve (30);  // 2^96 is largest intermediate result size
        uint128_t cur (1);
        for (int i = 0; i < 30; ++i)
        {
            result.push_back (cur);
            cur *= 10;
        };
        return result;
    }();

    // Return floor(log10(v))
    // Note: Returns -1 for v == 0
    static auto log10Floor = [](uint128_t const& v)
    {
        // Find the index of the first element >= the requested element, the index
        // is the log of the element in the log table.
        auto const l = std::lower_bound (powerTable.begin (), powerTable.end (), v);
        int index = std::distance (powerTable.begin (), l);
        // If we're not equal, subtract to get the floor
        if (*l != v)
            --index;
        return index;
    };

    // Return ceil(log10(v))
    static auto log10Ceil = [](uint128_t const& v)
    {
        // Find the index of the first element >= the requested element, the index
        // is the log of the element in the log table.
        auto const l = std::lower_bound (powerTable.begin (), powerTable.end (), v);
        return int(std::distance (powerTable.begin (), l));
    };

    static auto const fl64 =
        log10Floor (std::numeric_limits<std::int64_t>::max ());

    bool const neg = amt.mantissa () < 0;
    uint128_t const den128 (den);
    // a 32 value * a 64 bit value and stored in a 128 bit value. This will never overflow
    uint128_t const mul =
        uint128_t (neg ? -amt.mantissa () : amt.mantissa ()) * uint128_t (num);

    auto low = mul / den128;
    uint128_t rem (mul - low * den128);

    int exponent = amt.exponent ();

    if (rem)
    {
        // Mathematically, the result is low + rem/den128. However, since this
        // uses integer division rem/den128 will be zero. Scale the result so
        // low does not overflow the largest amount we can store in the mantissa
        // and (rem/den128) is as large as possible. Scale by multiplying low
        // and rem by 10 and subtracting one from the exponent. We could do this
        // with a loop, but it's more efficient to use logarithms.
        auto const roomToGrow = fl64 - log10Ceil (low);
        if (roomToGrow > 0)
        {
            exponent -= roomToGrow;
            low *= powerTable[roomToGrow];
            rem *= powerTable[roomToGrow];
        }
        auto const addRem = rem / den128;
        low += addRem;
        rem = rem - addRem * den128;
    }

    // The largest result we can have is ~2^95, which overflows the 64 bit
    // result we can store in the mantissa. Scale result down by dividing by ten
    // and adding one to the exponent until the low will fit in the 64-bit
    // mantissa. Use logarithms to avoid looping.
    bool hasRem = bool(rem);
    auto const mustShrink = log10Ceil (low) - fl64;
    if (mustShrink > 0)
    {
        uint128_t const sav (low);
        exponent += mustShrink;
        low /= powerTable[mustShrink];
        if (!hasRem)
            hasRem = bool(sav - low * powerTable[mustShrink]);
    }

    std::int64_t mantissa = low.convert_to<std::int64_t> ();

    // normalize before rounding
    if (neg)
        mantissa *= -1;

    IOUAmount result (mantissa, exponent);

    if (hasRem)
    {
        // handle rounding
        if (roundUp && !neg)
        {
            if (!result)
            {
                return IOUAmount (minMantissa, minExponent);
            }
            // This addition cannot overflow because the mantissa is already normalized
            return IOUAmount (result.mantissa () + 1, result.exponent ());
        }

        if (!roundUp && neg)
        {
            if (!result)
            {
                return IOUAmount (-minMantissa, minExponent);
            }
            // This subtraction cannot underflow because `result` is not zero
            return IOUAmount (result.mantissa () - 1, result.exponent ());
        }
    }

    return result;
}